

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

Vec_Int_t * Gia_PolynAddHaRoots(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *vXorPairs_00;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iRoot;
  int iLit1;
  int iLit0;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pObj;
  Vec_Int_t *vXorPairs;
  Vec_Int_t *vNewOuts;
  int iFan1;
  int iFan0;
  int i;
  Gia_Man_t *pGia_local;
  
  p = Vec_IntAlloc(100);
  vXorPairs_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManCoNum(pGia);
  pGVar3 = Gia_ManCo(pGia,iVar1 + -1);
  pGVar3 = Gia_ObjFanin0(pGVar3);
  Gia_PolynCoreNonXors_rec(pGia,pGVar3,vXorPairs_00);
  Gia_ManSetPhase(pGia);
  for (iFan1 = 0; iVar1 = Vec_IntSize(vXorPairs_00), iFan1 + 1 < iVar1; iFan1 = iFan1 + 2) {
    iVar1 = Vec_IntEntry(vXorPairs_00,iFan1);
    iVar2 = Vec_IntEntry(vXorPairs_00,iFan1 + 1);
    pGVar3 = Gia_ManObj(pGia,iVar1);
    pGVar4 = Gia_ManObj(pGia,iVar2);
    iVar1 = Abc_Var2Lit(iVar1,(uint)((ulong)*(undefined8 *)pGVar3 >> 0x3f));
    iVar2 = Abc_Var2Lit(iVar2,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3f));
    iVar1 = Gia_ManAppendAnd(pGia,iVar1,iVar2);
    iVar1 = Abc_Lit2Var(iVar1);
    Vec_IntPush(p,iVar1);
  }
  Vec_IntFree(vXorPairs_00);
  Vec_IntReverseOrder(p);
  return p;
}

Assistant:

Vec_Int_t * Gia_PolynAddHaRoots( Gia_Man_t * pGia )
{
    int i, iFan0, iFan1;
    Vec_Int_t * vNewOuts = Vec_IntAlloc( 100 );
    Vec_Int_t * vXorPairs = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj = Gia_ManCo( pGia, Gia_ManCoNum(pGia)-1 );
    Gia_PolynCoreNonXors_rec( pGia, Gia_ObjFanin0(pObj), vXorPairs );
    // add new outputs
    Gia_ManSetPhase( pGia );
    Vec_IntForEachEntryDouble( vXorPairs, iFan0, iFan1, i )
    {
        Gia_Obj_t * pFan0 = Gia_ManObj( pGia, iFan0 );
        Gia_Obj_t * pFan1 = Gia_ManObj( pGia, iFan1 );
        int iLit0 = Abc_Var2Lit( iFan0, pFan0->fPhase );
        int iLit1 = Abc_Var2Lit( iFan1, pFan1->fPhase );
        int iRoot = Gia_ManAppendAnd( pGia, iLit0, iLit1 );
        Vec_IntPush( vNewOuts, Abc_Lit2Var(iRoot) );
    }
    Vec_IntFree( vXorPairs );
    Vec_IntReverseOrder( vNewOuts );
//    Vec_IntPop( vNewOuts );
    return vNewOuts;
}